

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O1

OptimizerResult
TasGrid::Optimizer::computeMaximum<(TasGrid::TypeOneDRule)6>
          (CurrentNodes<(TasGrid::TypeOneDRule)6> *current)

{
  double *pdVar1;
  long lVar2;
  pointer pdVar3;
  pointer pdVar4;
  int iVar5;
  ulong uVar6;
  const_iterator __begin2;
  double *pdVar7;
  const_iterator __end2;
  vector<double,_std::allocator<double>_> *__range2;
  double *pdVar8;
  double dVar9;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar10;
  double dVar11;
  OptimizerResult OVar12;
  OptimizerResult OVar13;
  vector<double,_std::allocator<double>_> sorted;
  vector<double,_std::allocator<double>_> local_70;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  
  ::std::vector<double,_std::allocator<double>_>::vector(&local_70,&current->nodes);
  pdVar4 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar3 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar6 = (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar3,pdVar4);
  }
  pdVar7 = (current->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (current->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_28 = 1.0;
  dVar9 = 1.0;
  if (pdVar7 != pdVar1) {
    dVar9 = 1.0;
    pdVar8 = pdVar7;
    do {
      dVar9 = dVar9 * (-1.0 - *pdVar8);
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 != pdVar1);
  }
  dVar9 = ABS(dVar9);
  if (pdVar7 != pdVar1) {
    local_28 = 1.0;
    do {
      local_28 = local_28 * (1.0 - *pdVar7);
      pdVar7 = pdVar7 + 1;
    } while (pdVar7 != pdVar1);
  }
  local_28 = ABS(local_28);
  uStack_50 = 0;
  local_38 = (double)(~-(ulong)(dVar9 < local_28) & 0xbff0000000000000 |
                     -(ulong)(dVar9 < local_28) & 0x3ff0000000000000);
  uVar10 = 0;
  if (local_28 <= dVar9) {
    local_28 = dVar9;
  }
  OVar12.value = local_28;
  OVar12.node = local_38;
  uStack_20 = 0;
  uStack_30 = 0;
  iVar5 = (int)((ulong)((long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  if (1 < iVar5) {
    uVar6 = 0;
    uStack_50 = 0;
    do {
      local_48 = OVar12.value;
      local_58 = OVar12.node;
      uVar10 = 0;
      uStack_40 = uStack_50;
      OVar12 = computeLocalMaximum<(TasGrid::TypeOneDRule)6>
                         (current,local_70.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar6],
                          local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6 + 1]);
      uStack_50 = uVar10;
      uVar10 = extraout_XMM0_Qb;
      if (OVar12.value <= local_48) {
        OVar12.value = local_48;
        OVar12.node = local_58;
        uVar10 = 0;
        uStack_50 = uStack_40;
      }
      uVar6 = uVar6 + 1;
    } while (iVar5 - 1 != uVar6);
  }
  local_58 = OVar12.value;
  local_48 = OVar12.node;
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    uStack_40 = uVar10;
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    OVar12.value = local_58;
    OVar12.node = local_48;
  }
  dVar11 = OVar12.value;
  dVar9 = dVar11;
  if (dVar11 <= local_28) {
    dVar9 = local_28;
  }
  OVar13.node = (double)(~-(ulong)(local_28 < dVar11) & (ulong)local_38 |
                        (ulong)OVar12.node & -(ulong)(local_28 < dVar11));
  OVar13.value = dVar9;
  return OVar13;
}

Assistant:

OptimizerResult computeMaximum(CurrentNodes<rule> const& current){
    std::vector<double> sorted = current.nodes;
    std::sort(sorted.begin(), sorted.end());
    int num_intervals = (int) sorted.size() - 1;

    auto func = [&](double x)->OptimizerResult{ return {x, getValue<rule>(current, x)}; };

    OptimizerResult max_result = func(-1.0);

    OptimizerResult right_result = func(1.0);

    if (right_result.value > max_result.value)
        max_result = right_result;

    #pragma omp parallel
    {
        OptimizerResult thread_max = max_result, thread_result;

        #pragma omp for schedule(dynamic)
        for(int i=0; i<num_intervals; i++){
            thread_result = computeLocalMaximum(current, sorted[i], sorted[i+1]);
            if ((!std::isnan(thread_result.value)) && (thread_result.value > thread_max.value))
                thread_max = thread_result;
        }

        #pragma omp critical
        {
            if (thread_max.value > max_result.value){
                max_result = thread_max;
            }
        }
    }

    return max_result;
}